

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufSetAllocationScheme(xmlBufPtr buf,xmlBufferAllocationScheme scheme)

{
  xmlBufferAllocationScheme scheme_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    buf_local._4_4_ = -1;
  }
  else if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) || (buf->alloc == XML_BUFFER_ALLOC_IO)) {
    buf_local._4_4_ = -1;
  }
  else if ((((scheme == XML_BUFFER_ALLOC_DOUBLEIT) || (scheme == XML_BUFFER_ALLOC_EXACT)) ||
           (scheme == XML_BUFFER_ALLOC_HYBRID)) ||
          ((scheme == XML_BUFFER_ALLOC_IMMUTABLE || (scheme == XML_BUFFER_ALLOC_BOUNDED)))) {
    buf->alloc = scheme;
    if (buf->buffer != (xmlBufferPtr)0x0) {
      buf->buffer->alloc = scheme;
    }
    buf_local._4_4_ = 0;
  }
  else {
    if (scheme == XML_BUFFER_ALLOC_IO) {
      buf->alloc = XML_BUFFER_ALLOC_IO;
      buf->contentIO = buf->content;
    }
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufSetAllocationScheme(xmlBufPtr buf,
                          xmlBufferAllocationScheme scheme) {
    if ((buf == NULL) || (buf->error != 0)) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufSetAllocationScheme: buf == NULL or in error\n");
#endif
        return(-1);
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        (buf->alloc == XML_BUFFER_ALLOC_IO))
        return(-1);
    if ((scheme == XML_BUFFER_ALLOC_DOUBLEIT) ||
        (scheme == XML_BUFFER_ALLOC_EXACT) ||
        (scheme == XML_BUFFER_ALLOC_HYBRID) ||
        (scheme == XML_BUFFER_ALLOC_IMMUTABLE) ||
	(scheme == XML_BUFFER_ALLOC_BOUNDED)) {
	buf->alloc = scheme;
        if (buf->buffer)
            buf->buffer->alloc = scheme;
        return(0);
    }
    /*
     * Switching a buffer ALLOC_IO has the side effect of initializing
     * the contentIO field with the current content
     */
    if (scheme == XML_BUFFER_ALLOC_IO) {
        buf->alloc = XML_BUFFER_ALLOC_IO;
        buf->contentIO = buf->content;
    }
    return(-1);
}